

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.h
# Opt level: O3

void __thiscall Semaphore::acquire(Semaphore *this)

{
  int iVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  iVar1 = this->count;
  if (iVar1 < 1) {
    do {
      std::condition_variable::wait((unique_lock *)&this->cv);
      iVar1 = this->count;
    } while (iVar1 < 1);
  }
  this->count = iVar1 + -1;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void acquire()
    {
        std::unique_lock<std::mutex> lock(mutex);
        cv.wait(lock, [&](){return count > 0; });
        --count;
    }